

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# figures.cpp
# Opt level: O2

void __thiscall agge::rounded_rectangle::setup_bezier(rounded_rectangle *this,uint state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined4 uVar5;
  real_t rVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  switch(state) {
  case 0:
    uVar1 = this->_rx;
    uVar4 = this->_ry;
    fVar7 = this->_points[0].x;
    this->_xb = fVar7;
    rVar6 = this->_points[0].y;
    this->_yb = rVar6 + (float)uVar4;
    this->_xc1 = fVar7;
    this->_yc1 = (float)uVar4 * 0.44808495 + rVar6;
    this->_xc2 = (float)uVar1 * 0.44808495 + fVar7;
    this->_yc2 = rVar6;
    this->_xe = fVar7 + (float)uVar1;
    break;
  default:
    goto switchD_001a12d6_caseD_1;
  case 2:
    fVar7 = this->_rx;
    uVar3 = *(undefined8 *)&this->_points[0].y;
    fVar8 = (float)uVar3;
    fVar9 = (float)((ulong)uVar3 >> 0x20);
    this->_xb = fVar9 - fVar7;
    this->_yb = fVar8;
    this->_xc1 = fVar9 - fVar7 * 0.44808495;
    this->_yc1 = (real_t)(int)uVar3;
    this->_xc2 = (real_t)(int)((ulong)uVar3 >> 0x20);
    this->_yc2 = this->_ry * 0.44808495 + fVar8;
    this->_xe = fVar9;
    rVar6 = fVar7 + fVar8;
    break;
  case 4:
    fVar7 = this->_points[0].x;
    this->_xb = fVar7 + this->_rx;
    fVar8 = this->_points[1].y;
    this->_yb = fVar8;
    this->_xc1 = this->_rx * 0.44808495 + fVar7;
    this->_yc1 = fVar8;
    this->_xc2 = fVar7;
    this->_yc2 = fVar8 - this->_ry * 0.44808495;
    this->_xe = fVar7;
    rVar6 = fVar8 - this->_ry;
    break;
  case 6:
    uVar2 = this->_rx;
    uVar5 = this->_ry;
    fVar7 = this->_points[1].x;
    this->_xb = fVar7;
    rVar6 = this->_points[1].y;
    this->_yb = rVar6 - (float)uVar5;
    this->_xc1 = fVar7;
    this->_yc1 = rVar6 - (float)uVar5 * 0.44808495;
    this->_xc2 = fVar7 - (float)uVar2 * 0.44808495;
    this->_yc2 = rVar6;
    this->_xe = fVar7 - (float)uVar2;
  }
  this->_ye = rVar6;
switchD_001a12d6_caseD_1:
  this->_t = 0.0;
  return;
}

Assistant:

void rounded_rectangle::setup_bezier(unsigned state)
	{
		const real_t k_ = 1.0f - c_qarc_bezier_k;

		switch (state)
		{
		case left | top:
			_xb = _points[0].x, _yb = _points[0].y + _ry;
			_xc1 = _points[0].x, _yc1 = _points[0].y + k_ * _ry;
			_xc2 = _points[0].x + k_ * _rx, _yc2 = _points[0].y;
			_xe = _points[0].x + _rx, _ye = _points[0].y;
			break;

		case right | top:
			_xb = _points[1].x - _rx, _yb = _points[0].y;
			_xc1 = _points[1].x - k_ * _rx, _yc1 = _points[0].y;
			_xc2 = _points[1].x, _yc2 = _points[0].y + k_ * _ry;
			_xe = _points[1].x, _ye = _points[0].y + _rx;
			break;

		case right | bottom:
			_xb = _points[1].x, _yb = _points[1].y - _ry;
			_xc1 = _points[1].x, _yc1 = _points[1].y - k_ * _ry;
			_xc2 = _points[1].x - k_ * _rx, _yc2 = _points[1].y;
			_xe = _points[1].x - _rx, _ye = _points[1].y;
			break;

		case left | bottom:
			_xb = _points[0].x + _rx, _yb = _points[1].y;
			_xc1 = _points[0].x + k_ * _rx, _yc1 = _points[1].y;
			_xc2 = _points[0].x, _yc2 = _points[1].y - k_ * _ry;
			_xe = _points[0].x, _ye = _points[1].y - _ry;
			break;
		}
		_t = 0.0f;
	}